

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFields
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  int i;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(desc + 0x2c); lVar2 = lVar2 + 1) {
    bVar1 = anon_unknown_0::IgnoreField((FieldDescriptor *)(*(long *)(desc + 0x30) + lVar3));
    if (!bVar1) {
      GenerateClassField(this,options,printer,(FieldDescriptor *)(*(long *)(desc + 0x30) + lVar3));
    }
    lVar3 = lVar3 + 0xa8;
  }
  return;
}

Assistant:

void Generator::GenerateClassFields(const GeneratorOptions& options,
                                    io::Printer* printer,
                                    const Descriptor* desc) const {
  for (int i = 0; i < desc->field_count(); i++) {
    if (!IgnoreField(desc->field(i))) {
      GenerateClassField(options, printer, desc->field(i));
    }
  }
}